

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O1

Barcode * __thiscall
ZXing::OneD::DataBarExpandedReader::decodePattern
          (Barcode *__return_storage_ptr__,DataBarExpandedReader *this,int rowNumber,
          PatternView *view,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *state)

{
  int *__k;
  int *piVar1;
  long lVar2;
  pointer *ppPVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ushort uVar7;
  ushort uVar8;
  iterator __position;
  Character CVar9;
  Character CVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  pointer puVar15;
  int iVar16;
  DecodingState *pDVar17;
  vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>> *this_00;
  __normal_iterator<ZXing::OneD::DataBar::Pair_*,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>
  _Var18;
  mapped_type *pmVar19;
  Pair *pPVar20;
  Iterator puVar21;
  BitArray *extraout_RDX;
  BitArray *extraout_RDX_00;
  BitArray *extraout_RDX_01;
  BitArray *_bits;
  Character CVar22;
  pointer pPVar23;
  Pairs *__range2;
  int iVar24;
  uint uVar25;
  uint uVar26;
  Pair *__src;
  Character CVar27;
  Barcode *this_01;
  Pair *pair;
  Character CVar28;
  Pair *first;
  Character CVar29;
  Pair *pPVar30;
  bool bVar31;
  Pairs pairs;
  Pairs pairs_1;
  BitArray res;
  string txt;
  Pairs local_218;
  map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
  *local_1f8;
  Barcode *local_1f0;
  Content local_1e8;
  DetectorResult local_1a8;
  DecoderResult local_168;
  DecodingState *local_90;
  ByteArray local_88;
  string local_70;
  Position local_50;
  
  if ((state->_M_t).
      super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
      ._M_t.
      super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
      .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl ==
      (DecodingState *)0x0) {
    pDVar17 = (DecodingState *)operator_new(0x38);
    pDVar17->_vptr_DecodingState = (_func_int **)&PTR__DBERState_001f9590;
    *(undefined4 *)&pDVar17[2]._vptr_DecodingState = 0;
    pDVar17[3]._vptr_DecodingState = (_func_int **)0x0;
    pDVar17[4]._vptr_DecodingState = (_func_int **)(pDVar17 + 2);
    pDVar17[5]._vptr_DecodingState = (_func_int **)(pDVar17 + 2);
    pDVar17[6]._vptr_DecodingState = (_func_int **)0x0;
    (state->_M_t).
    super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    ._M_t.
    super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl = pDVar17;
  }
  local_90 = (state->_M_t).
             super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
             ._M_t.
             super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
             .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl;
  local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xffffffff;
  local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xffffffff;
  local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xffffffff00000000;
  local_168._content.encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xffffffff00000001;
  local_168._content.encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_168._content.encodings.
                         super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,1);
  view->_size = 0xf;
  puVar21 = view->_data;
  CVar28 = (Character)
           local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((puVar21 != (Iterator)0x0) &&
     (view->_data = puVar21 + 1, puVar21 + (long)view->_size + 1 <= view->_end)) {
    do {
      uVar7 = puVar21[0xd];
      iVar16 = (uint)puVar21[10] + (uint)puVar21[0xb];
      uVar26 = (uint)puVar21[0xc] + (uint)uVar7;
      if (((uVar26 * 9 < iVar16 * 2 + 5U) && (iVar16 * 2 + -5 < (int)(uVar26 * 0xd))) &&
         ((uint)puVar21[9] < (uint)uVar7 * 4 + 2)) {
        bVar31 = uVar26 < (uint)puVar21[9] << 2;
      }
      else {
        bVar31 = false;
      }
      CVar28 = (Character)
               local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar15 = local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      if (((bVar31) && ((uint)uVar7 + (uint)uVar7 * 2 < (uint)puVar21[0xb])) &&
         (bVar31 = IsCharacterPair(view),
         CVar28 = (Character)
                  local_168._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,
         puVar15 = local_168._content.bytes.
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage, bVar31)) {
        ReadPair((Pair *)&local_1a8,view,Right);
        local_168._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)local_1a8._bits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1a8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        puVar15 = local_168._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        local_168._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_168._content.encodings.
                               super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                               local_1a8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].
                               x);
        CVar28.value = local_1a8._bits._width;
        CVar28.checksum = local_1a8._bits._height;
        local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_1a8._bits._0_8_;
        local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1a8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)local_1a8._bits._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if ((uint)local_168._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage != 0) {
          bVar31 = (uint)local_168._content.bytes.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage != 1;
          local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(Character)
                        local_1a8._bits._bits.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish;
          if (bVar31) break;
          uVar7 = view->_data[-1];
          uVar8 = view->_data[0xb];
          CVar28 = (Character)
                   local_168._content.bytes.
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (((int)(((uint)uVar8 + (uint)uVar8 * 2 >> 2) - 2) < (int)(uint)uVar7) &&
             (local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = puVar15,
             (uint)uVar7 < (uint)uVar8 + (uint)(uVar8 >> 2) + 2)) break;
        }
      }
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar15;
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CVar28;
      puVar21 = view->_data;
      CVar9 = (Character)
              local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
      if ((puVar21 != (Iterator)0x0) &&
         (view->_data = puVar21 + 1, puVar21 + (long)view->_size + 1 <= view->_end)) {
        uVar7 = puVar21[9];
        iVar16 = (uint)puVar21[0xc] + (uint)puVar21[0xb];
        uVar26 = (uint)puVar21[10] + (uint)uVar7;
        if (((uVar26 * 9 < iVar16 * 2 + 5U) && (iVar16 * 2 + -5 < (int)(uVar26 * 0xd))) &&
           ((uint)puVar21[0xd] < (uint)uVar7 * 4 + 2)) {
          bVar31 = uVar26 < (uint)puVar21[0xd] << 2;
        }
        else {
          bVar31 = false;
        }
        if (((bVar31) && ((uint)uVar7 + (uint)uVar7 * 2 < (uint)puVar21[0xb])) &&
           (bVar31 = IsCharacterPair(view),
           CVar9 = (Character)
                   local_168._content.bytes.
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start, bVar31)) {
          ReadPair((Pair *)&local_1a8,view,Left);
          local_168._content.encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)local_1a8._bits._bits.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
          local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_1a8._bits._bits.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          puVar15 = local_168._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          local_168._content.encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(local_168._content.encodings.
                                 super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 local_1a8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems
                                 [0].x);
          CVar9.value = local_1a8._bits._width;
          CVar9.checksum = local_1a8._bits._height;
          local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1a8._bits._0_8_;
          local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1a8._bits._bits.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)local_1a8._bits._bits.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          bVar31 = (uint)local_168._content.bytes.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage != 0;
          CVar28 = (Character)
                   local_168._content.bytes.
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(Character)
                        local_1a8._bits._bits.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish;
          if (bVar31) break;
        }
      }
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CVar9;
      puVar21 = view->_data;
      CVar28 = (Character)
               local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((puVar21 == (Iterator)0x0) ||
         (view->_data = puVar21 + 1, view->_end < puVar21 + (long)view->_size + 1)) break;
    } while( true );
  }
  local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CVar28;
  local_1f0 = __return_storage_ptr__;
  if ((uint)local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage == 0) {
    view->_base = (Iterator)0x0;
    view->_end = (Iterator)0x0;
    view->_data = (Iterator)0x0;
    *(undefined8 *)&view->_size = 0;
    CVar22.value = 0;
    CVar22.checksum = 0;
    CVar27.value = 0;
    CVar27.checksum = 0;
    CVar29.value = 0;
    CVar29.checksum = 0;
  }
  else {
    CVar10 = (Character)
             local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    CVar28 = (Character)
             local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    while( true ) {
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)CVar28;
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CVar10;
      local_168._content.encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(rowNumber,
                             local_168._content.encodings.
                             super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>::
        _M_realloc_insert<ZXing::OneD::DataBar::Pair_const&>
                  ((vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>> *)
                   &local_1e8,
                   (iterator)
                   local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,(Pair *)&local_168);
      }
      else {
        *(undefined4 *)
         ((long)local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish + 0x20) =
             local_168._content.encodings.
             super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
             ._M_impl.super__Vector_impl_data._M_finish._0_4_;
        *(pointer *)
         ((long)local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish + 0x10) =
             local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        *(pointer *)
         ((long)local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish + 0x18) =
             local_168._content.encodings.
             super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish =
             local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) =
             local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)local_1e8.bytes.
                             super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 0x24);
      }
      bVar31 = (int)local_168._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish == -1;
      CVar28 = (Character)
               local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (((bVar31) || (puVar21 = view->_data, puVar21 == (Iterator)0x0)) ||
         (view->_data = puVar21 + 0x15, view->_end < puVar21 + (long)view->_size + 0x15)) break;
      ReadPair((Pair *)&local_1a8,view,
               (int)~(uint)local_168._content.bytes.
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage >> 0x1f | Right);
      CVar10.value = local_1a8._bits._width;
      CVar10.checksum = local_1a8._bits._height;
      local_168._content.encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)local_1a8._bits._bits.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_1a8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      CVar28 = (Character)
               local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      local_168._content.encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(local_168._content.encodings.
                             super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             local_1a8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x)
      ;
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1a8._bits._0_8_;
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1a8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      puVar15 = local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)local_1a8._bits._bits.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar15;
      if ((uint)local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == 0) break;
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           (int)local_1a8._bits._bits.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar31 = (int)local_168._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish == -1;
      if (bVar31) {
        uVar7 = *(ushort *)
                 ((long)view->_data +
                 (ulong)(~(uint)local_168._content.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage >> 0x1d &
                         0xfffffff6 | 0x12));
        uVar8 = view->_data[0xd];
        if (((int)(uint)uVar7 <= (int)(((uint)uVar8 + (uint)uVar8 * 2 >> 2) - 2)) ||
           (CVar10 = (Character)
                     local_168._content.bytes.
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
           (uint)uVar8 + (uint)(uVar8 >> 2) + 2 <= (uint)uVar7)) break;
      }
    }
    local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)CVar28;
    CVar27 = (Character)
             local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    CVar22 = (Character)
             local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    CVar29 = (Character)
             local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  pDVar17 = local_90;
  if ((Character)
      local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (Character)0x0) {
    operator_delete(local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f8 = (map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
               *)(pDVar17 + 1);
  for (CVar28 = CVar29; CVar28 != CVar22; CVar28 = (Character)((long)CVar28 + 0x24)) {
    this_00 = (vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>> *)
              std::
              map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
              ::operator[](local_1f8,(int *)((long)CVar28 + 0x10));
    _Var18 = std::
             __find_if<__gnu_cxx::__normal_iterator<ZXing::OneD::DataBar::Pair*,std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::OneD::DataBar::Pair_const>>
                       (*(undefined8 *)this_00,*(undefined8 *)(this_00 + 8),CVar28);
    __position._M_current = *(Pair **)(this_00 + 8);
    if (_Var18._M_current == __position._M_current) {
      if (__position._M_current == *(Pair **)(this_00 + 0x10)) {
        std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>::
        _M_realloc_insert<ZXing::OneD::DataBar::Pair_const&>(this_00,__position,(Pair *)CVar28);
      }
      else {
        (__position._M_current)->count = *(int *)((long)CVar28 + 0x20);
        CVar9 = *(Character *)CVar28;
        CVar10 = *(Character *)((long)CVar28 + 8);
        uVar11 = *(undefined8 *)((long)CVar28 + 0x18);
        *(undefined8 *)&(__position._M_current)->finder = *(undefined8 *)((long)CVar28 + 0x10);
        *(undefined8 *)&(__position._M_current)->xStop = uVar11;
        (__position._M_current)->left = CVar9;
        (__position._M_current)->right = CVar10;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x24;
      }
    }
    else {
      (_Var18._M_current)->count = (_Var18._M_current)->count + 1;
      if (_Var18._M_current != *(Pair **)this_00) {
        do {
          if ((_Var18._M_current)->count <= _Var18._M_current[-1].count) break;
          iVar16 = _Var18._M_current[-1].count;
          local_168._content.encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(local_168._content.encodings.
                                 super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,iVar16);
          local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)&_Var18._M_current[-1].left;
          local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = *(pointer *)&_Var18._M_current[-1].right;
          local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = _Var18._M_current[-1].finder;
          local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = _Var18._M_current[-1].xStart;
          local_168._content.encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_start = *(pointer *)&_Var18._M_current[-1].xStop;
          CVar9 = (_Var18._M_current)->right;
          iVar24 = (_Var18._M_current)->finder;
          iVar12 = (_Var18._M_current)->xStart;
          iVar13 = (_Var18._M_current)->xStop;
          iVar14 = (_Var18._M_current)->y;
          _Var18._M_current[-1].left = (_Var18._M_current)->left;
          _Var18._M_current[-1].right = CVar9;
          _Var18._M_current[-1].finder = iVar24;
          _Var18._M_current[-1].xStart = iVar12;
          _Var18._M_current[-1].xStop = iVar13;
          _Var18._M_current[-1].y = iVar14;
          _Var18._M_current[-1].count = (_Var18._M_current)->count;
          (_Var18._M_current)->left =
               (Character)
               local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          (_Var18._M_current)->right =
               (Character)
               local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (_Var18._M_current)->finder =
               (uint)local_168._content.bytes.
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          (_Var18._M_current)->xStart =
               local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
          *(pointer *)&(_Var18._M_current)->xStop =
               local_168._content.encodings.
               super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (_Var18._M_current)->count = iVar16;
          _Var18._M_current = _Var18._M_current + -1;
        } while (_Var18._M_current != *(Pair **)this_00);
      }
    }
  }
  if (CVar29 != (Character)0x0) {
    operator_delete((void *)CVar29,(long)CVar27 - (long)CVar29);
  }
  this_01 = local_1f0;
  if (CVar29 == CVar22) {
    memset(local_1f0,0,0xd8);
    Result::Result(this_01);
  }
  else {
    local_218.
    super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (Pair *)0x0;
    local_218.
    super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>.
    _M_impl.super__Vector_impl_data._M_finish = (Pair *)0x0;
    local_218.
    super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (Pair *)0x0;
    pmVar19 = std::
              map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
              ::operator[](local_1f8,&FINDER_A);
    pPVar20 = (pmVar19->
              super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (pPVar30 = (pmVar19->
                   super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                   )._M_impl.super__Vector_impl_data._M_start; pPVar30 != pPVar20;
        pPVar30 = pPVar30 + 1) {
      iVar16 = (pPVar30->left).value;
      iVar24 = iVar16 >> 0x1f;
      iVar16 = iVar16 / 0xd3 + iVar24;
      iVar24 = ((iVar16 - iVar24) - ((iVar16 - iVar24) + 5 >> 0x1f)) + 5 >> 1;
      iVar16 = 3;
      if (iVar24 <= *(int *)&pDVar17[6]._vptr_DecodingState) {
        if (local_218.
            super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_218.
            super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>::
          _M_realloc_insert<ZXing::OneD::DataBar::Pair_const&>
                    ((vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>
                      *)&local_218,
                     (iterator)
                     local_218.
                     super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                     ._M_impl.super__Vector_impl_data._M_finish,pPVar30);
        }
        else {
          (local_218.
           super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
           ._M_impl.super__Vector_impl_data._M_finish)->count = pPVar30->count;
          CVar28 = pPVar30->left;
          CVar9 = pPVar30->right;
          iVar16 = pPVar30->xStart;
          iVar12 = pPVar30->xStop;
          iVar13 = pPVar30->y;
          (local_218.
           super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
           ._M_impl.super__Vector_impl_data._M_finish)->finder = pPVar30->finder;
          (local_218.
           super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
           ._M_impl.super__Vector_impl_data._M_finish)->xStart = iVar16;
          (local_218.
           super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
           ._M_impl.super__Vector_impl_data._M_finish)->xStop = iVar12;
          (local_218.
           super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
           ._M_impl.super__Vector_impl_data._M_finish)->y = iVar13;
          (local_218.
           super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
           ._M_impl.super__Vector_impl_data._M_finish)->left = CVar28;
          (local_218.
           super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
           ._M_impl.super__Vector_impl_data._M_finish)->right = CVar9;
          local_218.
          super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_218.
               super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar2 = (long)(iVar24 + -2) * 0x18;
        bVar31 = FindValidSequence<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                           (local_1f8,(int *)(*(long *)(FINDER_PATTERN_SEQUENCES + lVar2) + 4),
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            )*(int **)(FINDER_PATTERN_SEQUENCES + lVar2 + 8),&local_218);
        iVar16 = 2;
        if (!bVar31) {
          local_218.
          super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_218.
               super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          iVar16 = 0;
        }
      }
      if ((iVar16 != 3) && (iVar16 != 0)) break;
    }
    this_01 = local_1f0;
    if (local_218.
        super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_218.
        super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      memset(local_1f0,0,0xd8);
      Result::Result(this_01);
    }
    else {
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar26 = ((local_218.
                 super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                 ._M_impl.super__Vector_impl_data._M_start)->right).value;
      uVar25 = 0xb;
      do {
        local_1a8._bits._width._0_1_ = (uVar26 >> (uVar25 & 0x1f) & 1) != 0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168,
                   (uchar *)&local_1a8);
        bVar31 = uVar25 != 0;
        uVar25 = uVar25 - 1;
      } while (bVar31);
      _bits = extraout_RDX;
      if (local_218.
          super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
          ._M_impl.super__Vector_impl_data._M_start + 1 !=
          local_218.
          super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pPVar30 = local_218.
                  super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
        pPVar23 = local_218.
                  super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pPVar20 = pPVar30;
          uVar26 = pPVar23[1].left.value;
          uVar25 = 0xb;
          do {
            local_1a8._bits._width._0_1_ = (uVar26 >> (uVar25 & 0x1f) & 1) != 0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168,
                       (uchar *)&local_1a8);
            bVar31 = uVar25 != 0;
            uVar25 = uVar25 - 1;
          } while (bVar31);
          uVar26 = pPVar23[1].right.value;
          _bits = extraout_RDX_00;
          if (uVar26 != 0xffffffff) {
            uVar25 = 0xb;
            do {
              local_1a8._bits._width._0_1_ = (uVar26 >> (uVar25 & 0x1f) & 1) != 0;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168,
                         (uchar *)&local_1a8);
              bVar31 = uVar25 != 0;
              uVar25 = uVar25 - 1;
              _bits = extraout_RDX_01;
            } while (bVar31);
          }
          pPVar30 = pPVar20 + 1;
          pPVar23 = pPVar20;
        } while (pPVar30 !=
                 local_218.
                 super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      DataBar::DecodeExpandedBits_abi_cxx11_(&local_70,(DataBar *)&local_168,_bits);
      this_01 = local_1f0;
      if ((Character)
          local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (Character)0x0) {
        operator_delete(local_168._content.bytes.
                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168._content.bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168._content.bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pPVar23 = local_218.
                super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pPVar30 = local_218.
                super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_70._M_string_length == 0) {
        memset(this_01,0,0xd8);
        Result::Result(this_01);
      }
      else {
        for (; pPVar30 != pPVar23; pPVar30 = pPVar30 + 1) {
          __k = &pPVar30->finder;
          pmVar19 = std::
                    map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                    ::operator[](local_1f8,__k);
          _Var18 = std::
                   __find_if<__gnu_cxx::__normal_iterator<ZXing::OneD::DataBar::Pair*,std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::OneD::DataBar::Pair_const>>
                             ((pmVar19->
                              super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                              )._M_impl.super__Vector_impl_data._M_start,
                              (pmVar19->
                              super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                              )._M_impl.super__Vector_impl_data._M_finish,pPVar30);
          pmVar19 = std::
                    map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                    ::operator[](local_1f8,__k);
          if (_Var18._M_current !=
              (pmVar19->
              super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            piVar1 = &(_Var18._M_current)->count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              pmVar19 = std::
                        map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                        ::operator[](local_1f8,__k);
              __src = _Var18._M_current + 1;
              pPVar20 = (pmVar19->
                        super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              if (__src != pPVar20) {
                memmove(_Var18._M_current,__src,(long)pPVar20 - (long)__src);
              }
              ppPVar3 = &(pmVar19->
                         super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppPVar3 = *ppPVar3 + -1;
            }
          }
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_70._M_dataplus._M_p,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(local_70._M_dataplus._M_p + local_70._M_string_length),
                   (allocator_type *)&local_1a8);
        Content::Content(&local_1e8,&local_88,(SymbologyIdentifier)0x1003065);
        paVar4 = &local_168._ecLevel.field_2;
        local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_168._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_1e8.encodings.
             super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_168._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_1e8.encodings.
             super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_168._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1e8.encodings.
             super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1e8.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1e8.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_168._content.symbology = local_1e8.symbology;
        local_168._content.defaultCharset = local_1e8.defaultCharset;
        local_168._content.hasECI = local_1e8.hasECI;
        local_168._ecLevel._M_string_length = 0;
        local_168._ecLevel.field_2._M_local_buf[0] = '\0';
        local_168._lineCount = 0;
        local_168._versionNumber = 0;
        local_168._structuredAppend.index = -1;
        local_168._structuredAppend.count = -1;
        paVar5 = &local_168._structuredAppend.id.field_2;
        local_168._structuredAppend.id._M_string_length = 0;
        local_168._structuredAppend.id.field_2._M_local_buf[0] = '\0';
        local_168._isMirrored = false;
        local_168._readerInit = false;
        paVar6 = &local_168._error._msg.field_2;
        local_168._error._msg._M_string_length = 0;
        local_168._error._msg.field_2._M_local_buf[0] = '\0';
        local_168._error._file = (char *)0x0;
        local_168._error._line = -1;
        local_168._error._type = None;
        local_168._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_168._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_168._ecLevel._M_dataplus._M_p = (pointer)paVar4;
        local_168._structuredAppend.id._M_dataplus._M_p = (pointer)paVar5;
        local_168._error._msg._M_dataplus._M_p = (pointer)paVar6;
        iVar16 = DataBar::EstimateLineCount
                           (local_218.
                            super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            local_218.
                            super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
        this_01 = local_1f0;
        local_168._lineCount = iVar16;
        DataBar::EstimatePosition
                  (&local_50,
                   local_218.
                   super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_218.
                   super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        local_1a8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8._bits._width = 0;
        local_1a8._bits._height = 0;
        local_1a8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0] =
             local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[0];
        local_1a8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1] =
             local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[1];
        local_1a8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2] =
             local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[2];
        local_1a8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3] =
             local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[3];
        Result::Result(this_01,&local_168,&local_1a8,DataBarExpanded);
        if ((Character)
            local_1a8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (Character)0x0) {
          operator_delete(local_1a8._bits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1a8._bits._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a8._bits._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_168._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_168._extra.
                     super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._error._msg._M_dataplus._M_p != paVar6) {
          operator_delete(local_168._error._msg._M_dataplus._M_p,
                          CONCAT71(local_168._error._msg.field_2._M_allocated_capacity._1_7_,
                                   local_168._error._msg.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._structuredAppend.id._M_dataplus._M_p != paVar5) {
          operator_delete(local_168._structuredAppend.id._M_dataplus._M_p,
                          CONCAT71(local_168._structuredAppend.id.field_2._M_allocated_capacity.
                                   _1_7_,local_168._structuredAppend.id.field_2._M_local_buf[0]) + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._ecLevel._M_dataplus._M_p != paVar4) {
          operator_delete(local_168._ecLevel._M_dataplus._M_p,
                          CONCAT71(local_168._ecLevel.field_2._M_allocated_capacity._1_7_,
                                   local_168._ecLevel.field_2._M_local_buf[0]) + 1);
        }
        if (local_168._content.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_168._content.encodings.
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_168._content.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_168._content.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((Character)
            local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (Character)0x0) {
          operator_delete(local_168._content.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_168._content.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_168._content.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1e8.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e8.encodings.
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1e8.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e8.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((Character)
            local_1e8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (Character)0x0) {
          operator_delete(local_1e8.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1e8.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e8.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_88.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_218.
        super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>.
        _M_impl.super__Vector_impl_data._M_start != (Pair *)0x0) {
      operator_delete(local_218.
                      super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_218.
                            super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_218.
                            super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return this_01;
}

Assistant:

Barcode DataBarExpandedReader::decodePattern(int rowNumber, PatternView& view, std::unique_ptr<RowReader::DecodingState>& state) const
{
#if 0 // non-stacked version
	auto pairs = ReadRowOfPairs<false>(view, rowNumber);

	if (pairs.empty() || !ChecksumIsValid(pairs))
		return {};
#else
	if (!state)
		state.reset(new DBERState);
	auto& allPairs = static_cast<DBERState*>(state.get())->allPairs;

	// Stacked codes can be laid out in a number of ways. The following rules apply:
	//  * the first row starts with FINDER_A in left-to-right (l2r) layout
	//  * pairs in l2r layout start with a space, r2l ones with a bar
	//  * l2r and r2l finders always alternate
	//  * rows may contain any number of pairs
	//  * even rows may be reversed
	//  * a l2r pair that starts with a bar is actually a r2l pair on a reversed line
	//  * the last pair of the symbol may be missing the right character
	//
	// 3 examples: (r == l2r, l == r2l, R/L == r/l but reversed)
	//    r l r l    |    r l     |     r l r
	//    L R L R    |    r       |     l

	if (!Insert(allPairs, ReadRowOfPairs<true>(view, rowNumber)))
		return {};

	auto pairs = FindValidSequence(allPairs);
	if (pairs.empty())
		return {};
#endif

	auto txt = DecodeExpandedBits(BuildBitArray(pairs));
	if (txt.empty())
		return {};

	RemovePairs(allPairs, pairs);

	// TODO: EstimatePosition misses part of the symbol in the stacked case where the last row contains less pairs than
	// the first
	// Symbology identifier: ISO/IEC 24724:2011 Section 9 and GS1 General Specifications 5.1.3 Figure 5.1.3-2
	return {DecoderResult(Content(ByteArray(txt), {'e', '0', 0, AIFlag::GS1}))
				.setLineCount(EstimateLineCount(pairs.front(), pairs.back())),
			{{}, EstimatePosition(pairs.front(), pairs.back())}, BarcodeFormat::DataBarExpanded};
}